

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O2

void __thiscall
Imath_3_2::Quat<double>::setRotationInternal
          (Quat<double> *this,Vec3<double> *f0,Vec3<double> *t0,Quat<double> *q)

{
  Vec3<double> h0;
  Vec3<double> local_58;
  Vec3<double> local_38;
  
  local_58.z = f0->z + t0->z;
  local_58.x = t0->x + f0->x;
  local_58.y = t0->y + f0->y;
  Vec3<double>::normalized(&local_38,&local_58);
  q->r = f0->z * local_38.z + f0->x * local_38.x + f0->y * local_38.y;
  Vec3<double>::operator%(f0,&local_38);
  (q->v).x = local_58.x;
  (q->v).y = local_58.y;
  (q->v).z = local_58.z;
  return;
}

Assistant:

IMATH_HOSTDEVICE inline void
Quat<T>::setRotationInternal (const Vec3<T>& f0, const Vec3<T>& t0, Quat<T>& q)
    IMATH_NOEXCEPT
{
    //
    // The following is equivalent to setAxisAngle(n,2*phi),
    // where the rotation axis, n, is orthogonal to the f0 and
    // t0 vectors, and 2*phi is the angle between f0 and t0.
    //
    // This function is called by setRotation(), above; it assumes
    // that f0 and t0 are normalized and that the angle between
    // them is not much greater than pi/2.  This function becomes
    // numerically inaccurate if f0 and t0 point into nearly
    // opposite directions.
    //

    //
    // Find a normalized vector, h0, that is halfway between f0 and t0.
    // The angle between f0 and h0 is phi.
    //

    Vec3<T> h0 = (f0 + t0).normalized ();

    //
    // Store the rotation axis and rotation angle.
    //

    q.r = f0 ^ h0; //  f0 ^ h0 == cos (phi)
    q.v = f0 % h0; // (f0 % h0).length() == sin (phi)
}